

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O3

void print_helper2(size_t *i)

{
  size_t sVar1;
  
  sVar1 = *i;
  if (sVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|  Cost  ",9);
    sVar1 = *i;
  }
  if (sVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|  Exp   ",9);
    sVar1 = *i;
  }
  if (sVar1 == 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|  Gas   ",9);
    sVar1 = *i;
  }
  if (sVar1 == 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|  Comf  ",9);
    return;
  }
  return;
}

Assistant:

void print_helper2(size_t &i) {
    if (i == 0)
        std::cout << "|  Cost  ";
    if (i == 1)
        std::cout << "|  Exp   ";
    if (i == 2)
        std::cout << "|  Gas   ";
    if (i == 3)
        std::cout << "|  Comf  ";

}